

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VInvTest_Serial(N_Vector x,N_Vector z)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int local_3c;
  int no_zero_found;
  realtype *zd;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector x_local;
  
  lVar2 = *x->content;
  lVar3 = *(long *)((long)x->content + 0x10);
  lVar4 = *(long *)((long)z->content + 0x10);
  local_3c = 1;
  for (N = 0; N < lVar2; N = N + 1) {
    dVar1 = *(double *)(lVar3 + N * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      *(double *)(lVar4 + N * 8) = 1.0 / *(double *)(lVar3 + N * 8);
    }
    else {
      local_3c = 0;
    }
  }
  return local_3c;
}

Assistant:

booleantype N_VInvTest_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;
  booleantype no_zero_found;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  no_zero_found = SUNTRUE;
  for (i = 0; i < N; i++) {
    if (xd[i] == ZERO)
      no_zero_found = SUNFALSE;
    else
      zd[i] = ONE/xd[i];
  }

  return no_zero_found;
}